

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O3

void __thiscall
QGraphicsTextItem::mouseReleaseEvent(QGraphicsTextItem *this,QGraphicsSceneMouseEvent *event)

{
  byte bVar1;
  QWidgetTextControl *this_00;
  char cVar2;
  bool bVar3;
  QFlagsStorage<Qt::TextInteractionFlag> QVar4;
  QFlagsStorage<Qt::MouseButton> QVar5;
  MouseButtons MVar6;
  TextInteractionFlags TVar7;
  MouseButton MVar8;
  int iVar9;
  QWidget *pQVar10;
  QWidgetPrivate *pQVar11;
  QStyle *pQVar12;
  long in_FS_OFFSET;
  double in_XMM1_Qa;
  QPointF QVar13;
  QPointF local_50 [2];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(char *)(*(long *)(this + 0x20) + 0x2c) != '\x01') {
    pQVar10 = QGraphicsSceneEvent::widget(&event->super_QGraphicsSceneEvent);
    if (pQVar10 != (QWidget *)0x0) {
      TVar7 = QWidgetTextControl::textInteractionFlags
                        ((QWidgetTextControl *)**(undefined8 **)(this + 0x20));
      if (((uint)TVar7.super_QFlagsStorageHelper<Qt::TextInteractionFlag,_4>.
                 super_QFlagsStorage<Qt::TextInteractionFlag>.i & 0x10) != 0) {
        (**(code **)(*(long *)this + 0x60))(local_50,this);
        QVar13 = QGraphicsSceneMouseEvent::pos(event);
        in_XMM1_Qa = QVar13.yp;
        cVar2 = QRectF::contains(local_50);
        if (cVar2 != '\0') {
          pQVar11 = qt_widget_private(pQVar10);
          MVar8 = QGraphicsSceneMouseEvent::button(event);
          if (MVar8 == LeftButton) {
            bVar1 = *(byte *)(*(long *)(this + 0x20) + 0x2e);
            pQVar10 = *(QWidget **)&pQVar11->field_0x8;
            bVar3 = QApplication::autoSipEnabled(QCoreApplication::self);
            if (bVar3) {
              pQVar12 = QWidget::style(pQVar10);
              iVar9 = (**(code **)(*(long *)pQVar12 + 0xf0))(pQVar12,0x5f,0,pQVar10,0);
              if (((bVar1 & 1) == 0) || (iVar9 == 1)) {
                QGuiApplication::inputMethod();
                QInputMethod::show();
              }
            }
          }
        }
      }
    }
    *(byte *)(*(long *)(this + 0x20) + 0x2e) = *(byte *)(*(long *)(this + 0x20) + 0x2e) & 0xfe;
    this_00 = (QWidgetTextControl *)**(undefined8 **)(this + 0x20);
    if (this_00 != (QWidgetTextControl *)0x0) {
      iVar9 = *(int *)(*(undefined8 **)(this + 0x20) + 5);
      QWidgetTextControl::document(this_00);
      QTextDocument::pageSize();
      local_50[0].yp = in_XMM1_Qa * (double)iVar9;
      local_50[0].xp = 0.0;
      QWidgetTextControl::processEvent(this_00,(QEvent *)event,local_50,(QWidget *)0x0);
    }
    goto LAB_005e7c01;
  }
  QGraphicsItem::mouseReleaseEvent((QGraphicsItem *)(this + 0x10),event);
  QVar4.i = (Int)QWidgetTextControl::textInteractionFlags
                           ((QWidgetTextControl *)**(undefined8 **)(this + 0x20));
  if ((QFlagsStorage<Qt::TextInteractionFlag>)QVar4.i == (QFlagsStorage<Qt::TextInteractionFlag>)0x0
     ) {
    QVar5.i = (Int)QGraphicsSceneMouseEvent::buttons(event);
    if ((QFlagsStorage<Qt::MouseButton>)QVar5.i != (QFlagsStorage<Qt::MouseButton>)0x0)
    goto LAB_005e7ac4;
  }
  else {
LAB_005e7ac4:
    MVar6 = QGraphicsSceneMouseEvent::buttons(event);
    if (((uint)MVar6.super_QFlagsStorageHelper<Qt::MouseButton,_4>.
               super_QFlagsStorage<Qt::MouseButton>.i & 1) != 0) goto LAB_005e7c01;
  }
  *(undefined1 *)(*(long *)(this + 0x20) + 0x2c) = 0;
LAB_005e7c01:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsTextItem::mouseReleaseEvent(QGraphicsSceneMouseEvent *event)
{
    if (dd->useDefaultImpl) {
        QGraphicsItem::mouseReleaseEvent(event);
        if (dd->control->textInteractionFlags() == Qt::NoTextInteraction
            && !event->buttons()) {
            // User released last button on non-interactive item.
            dd->useDefaultImpl = false;
        } else  if ((event->buttons() & Qt::LeftButton) == 0) {
            // User released the left button on an interactive item.
            dd->useDefaultImpl = false;
        }
        return;
    }

    QWidget *widget = event->widget();
    if (widget && (dd->control->textInteractionFlags() & Qt::TextEditable) && boundingRect().contains(event->pos())) {
        qt_widget_private(widget)->handleSoftwareInputPanel(event->button(), dd->clickCausedFocus);
    }
    dd->clickCausedFocus = 0;
    dd->sendControlEvent(event);
}